

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

vector<float,_std::allocator<float>_> *
deqp::gles31::Functional::anon_unknown_1::generateRandomPatchTessLevels
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,int numPatches,
          int constantOuterLevelIndex,float constantOuterLevel,Random *rnd)

{
  pointer pfVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  vector<float,_std::allocator<float>_> *extraout_RAX;
  vector<float,_std::allocator<float>_> *pvVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  float fVar9;
  allocator_type local_59;
  int local_58;
  float local_54;
  vector<float,_std::allocator<float>_> *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_54 = constantOuterLevel;
  local_50 = __return_storage_ptr__;
  std::vector<float,_std::allocator<float>_>::vector
            (__return_storage_ptr__,(ulong)(uint)(numPatches * 6),&local_59);
  pvVar5 = extraout_RAX;
  if (0 < numPatches) {
    local_48 = (ulong)(uint)numPatches;
    pvVar5 = (vector<float,_std::allocator<float>_> *)0x2;
    local_40 = 0;
    do {
      local_58 = (int)pvVar5;
      local_38 = (long)local_58 << 2;
      iVar2 = (int)local_40;
      pfVar1 = (local_50->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      bVar4 = true;
      do {
        bVar7 = bVar4;
        fVar9 = deRandom_getFloat(&rnd->m_rnd);
        lVar3 = local_38;
        pfVar1[iVar2 * 6 + lVar6] = fVar9 * 61.0 + 1.0;
        lVar6 = 1;
        bVar4 = false;
      } while (bVar7);
      uVar8 = 0;
      do {
        fVar9 = local_54;
        if ((uint)constantOuterLevelIndex != uVar8) {
          fVar9 = deRandom_getFloat(&rnd->m_rnd);
          fVar9 = fVar9 * 61.0 + 1.0;
        }
        *(float *)((long)pfVar1 + uVar8 * 4 + lVar3) = fVar9;
        uVar8 = uVar8 + 1;
      } while (uVar8 != 4);
      local_40 = local_40 + 1;
      pvVar5 = (vector<float,_std::allocator<float>_> *)(ulong)(local_58 + 6);
    } while (local_40 != local_48);
  }
  return pvVar5;
}

Assistant:

vector<float> generateRandomPatchTessLevels (int numPatches, int constantOuterLevelIndex, float constantOuterLevel, de::Random& rnd)
{
	vector<float> tessLevels(numPatches*6);

	for (int patchNdx = 0; patchNdx < numPatches; patchNdx++)
	{
		float* const inner = &tessLevels[patchNdx*6 + 0];
		float* const outer = &tessLevels[patchNdx*6 + 2];

		for (int j = 0; j < 2; j++)
			inner[j] = rnd.getFloat(1.0f, 62.0f);
		for (int j = 0; j < 4; j++)
			outer[j] = j == constantOuterLevelIndex ? constantOuterLevel : rnd.getFloat(1.0f, 62.0f);
	}

	return tessLevels;
}